

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::report_selfint_edge
          (tetgenmesh *this,point e1,point e2,face *iedge,triface *itet,interresult dir)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  verttype vVar5;
  point pdVar6;
  shellface ppdVar7;
  point pdVar8;
  point pt;
  point pt_00;
  uint local_280;
  uint local_270;
  uint local_230;
  uint local_220;
  uint local_1d8;
  double local_1c0;
  double u;
  double ip [3];
  point p3_1;
  point p2_3;
  point p1_3;
  face checksh;
  double tq;
  double tp;
  double Q [3];
  double local_148;
  double P [3];
  point p2_2;
  point p1_2;
  face parentsh_4;
  face checkseg;
  point p3;
  point p2_1;
  point p1_1;
  face parentsh_3;
  point p2;
  point p1;
  face parentsh_2;
  face parentseg;
  point pp;
  face colface;
  face parentsh_1;
  face colseg;
  face parentsh;
  uint local_58;
  int facemark;
  int geomtag;
  int etype;
  point fapex;
  point fdest;
  point forg;
  interresult dir_local;
  triface *itet_local;
  face *iedge_local;
  point e2_local;
  point e1_local;
  tetgenmesh *this_local;
  
  fdest = (point)0x0;
  fapex = (point)0x0;
  _geomtag = (point)0x0;
  facemark = 0;
  local_58 = 0;
  parentsh._12_4_ = 0;
  if (iedge != (face *)0x0) {
    if (iedge->sh[5] == (shellface)0x0) {
      facemark = 1;
      fdest = farsorg(this,iedge);
      fapex = farsdest(this,iedge);
      face::face((face *)&colseg.shver);
      spivot(this,iedge,(face *)&colseg.shver);
      if (colseg._8_8_ != 0) {
        parentsh._12_4_ = shellmark(this,(face *)&colseg.shver);
      }
    }
    else {
      facemark = 2;
      _geomtag = sapex(this,iedge);
      parentsh._12_4_ = shellmark(this,iedge);
      fapex = e2;
      fdest = e1;
    }
    local_58 = shellmark(this,iedge);
  }
  if (dir == SHAREEDGE) {
    face::face((face *)&parentsh_1.shver);
    tsspivot1(this,itet,(face *)&parentsh_1.shver);
    if (facemark == 1) {
      if ((shellface *)parentsh_1._8_8_ == iedge->sh) {
        terminatetetgen(this,2);
      }
      else {
        face::face((face *)&colface.shver);
        spivot(this,(face *)&parentsh_1.shver,(face *)&colface.shver);
        printf("PLC Error:  Two segments are overlapping.\n");
        pdVar6 = sorg(this,(face *)&parentsh_1.shver);
        uVar1 = pointmark(this,pdVar6);
        pdVar6 = sdest(this,(face *)&parentsh_1.shver);
        uVar2 = pointmark(this,pdVar6);
        uVar3 = shellmark(this,(face *)&parentsh_1.shver);
        if (colface._8_8_ == 0) {
          local_1d8 = 0;
        }
        else {
          local_1d8 = shellmark(this,(face *)&colface.shver);
        }
        printf("  Segment 1: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)local_1d8);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        printf("  Segment 2: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)local_58,
               (ulong)(uint)parentsh._12_4_);
      }
    }
    else if (facemark == 2) {
      printf("PLC Error:  A segment lies in a facet.\n");
      pdVar6 = sorg(this,(face *)&parentsh_1.shver);
      uVar1 = pointmark(this,pdVar6);
      pdVar6 = sdest(this,(face *)&parentsh_1.shver);
      uVar2 = pointmark(this,pdVar6);
      uVar3 = shellmark(this,(face *)&parentsh_1.shver);
      printf("  Segment: [%d, %d] #%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
      uVar1 = pointmark(this,fdest);
      uVar2 = pointmark(this,fapex);
      uVar3 = pointmark(this,_geomtag);
      printf("  Facet:   [%d,%d,%d] #%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)local_58);
    }
  }
  else if (dir == SHAREFACE) {
    face::face((face *)&pp);
    tspivot(this,itet,(face *)&pp);
    if (facemark == 2) {
      if ((shellface *)pp == iedge->sh) {
        terminatetetgen(this,2);
      }
      else {
        printf("PLC Error:  Two facets are overlapping.\n");
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        uVar3 = pointmark(this,_geomtag);
        printf("  Facet 1:  [%d,%d,%d] #%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)local_58
              );
        pdVar6 = sorg(this,(face *)&pp);
        uVar1 = pointmark(this,pdVar6);
        pdVar6 = sdest(this,(face *)&pp);
        uVar2 = pointmark(this,pdVar6);
        pdVar6 = sapex(this,(face *)&pp);
        uVar3 = pointmark(this,pdVar6);
        uVar4 = shellmark(this,(face *)&pp);
        printf("  Facet 2:  [%d,%d,%d] #%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
      }
    }
    else {
      terminatetetgen(this,2);
    }
  }
  else if (dir == ACROSSVERT) {
    pdVar6 = dest(this,itet);
    vVar5 = pointtype(this,pdVar6);
    if (((vVar5 == RIDGEVERTEX) || (vVar5 = pointtype(this,pdVar6), vVar5 == FACETVERTEX)) ||
       (vVar5 = pointtype(this,pdVar6), vVar5 == VOLVERTEX)) {
      if (facemark == 1) {
        printf("PLC Error:  A vertex lies in a segment.\n");
        uVar1 = pointmark(this,pdVar6);
        printf("  Vertex:  [%d] (%g,%g,%g).\n",*pdVar6,pdVar6[1],pdVar6[2],(ulong)uVar1);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        printf("  Segment: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)local_58,
               (ulong)(uint)parentsh._12_4_);
      }
      else if (facemark == 2) {
        printf("PLC Error:  A vertex lies in a facet.\n");
        uVar1 = pointmark(this,pdVar6);
        printf("  Vertex: [%d] (%g,%g,%g).\n",*pdVar6,pdVar6[1],pdVar6[2],(ulong)uVar1);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        uVar3 = pointmark(this,_geomtag);
        printf("  Facet:  [%d,%d,%d] #%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)local_58);
      }
    }
    else {
      vVar5 = pointtype(this,pdVar6);
      if (vVar5 == FREESEGVERTEX) {
        face::face((face *)&parentsh_2.shver);
        face::face((face *)&p1);
        ppdVar7 = point2sh(this,pdVar6);
        sdecode(this,ppdVar7,(face *)&parentsh_2.shver);
        spivot(this,(face *)&parentsh_2.shver,(face *)&p1);
        if (parentsh_2._8_8_ == 0) {
          terminatetetgen(this,2);
        }
        else {
          pdVar8 = farsorg(this,(face *)&parentsh_2.shver);
          parentsh_3._8_8_ = farsdest(this,(face *)&parentsh_2.shver);
          if (facemark == 1) {
            printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",*pdVar6,pdVar6[1],
                   pdVar6[2]);
            uVar1 = pointmark(this,fdest);
            uVar2 = pointmark(this,fapex);
            printf("  Segment 1: [%d, %d], #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)local_58,
                   (ulong)(uint)parentsh._12_4_);
            uVar1 = pointmark(this,pdVar8);
            uVar2 = pointmark(this,(point)parentsh_3._8_8_);
            uVar3 = shellmark(this,(face *)&parentsh_2.shver);
            if (p1 == (point)0x0) {
              local_220 = 0;
            }
            else {
              local_220 = shellmark(this,(face *)&p1);
            }
            printf("  Segment 2: [%d, %d], #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                   (ulong)local_220);
          }
          else if (facemark == 2) {
            printf("PLC Error:  A segment and a facet intersect at point");
            printf(" (%g,%g,%g).\n",*pdVar6,pdVar6[1],pdVar6[2]);
            uVar1 = pointmark(this,pdVar8);
            uVar2 = pointmark(this,(point)parentsh_3._8_8_);
            uVar3 = shellmark(this,(face *)&parentsh_2.shver);
            if (p1 == (point)0x0) {
              local_230 = 0;
            }
            else {
              local_230 = shellmark(this,(face *)&p1);
            }
            printf("  Segment: [%d, %d], #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                   (ulong)local_230);
            uVar1 = pointmark(this,fdest);
            uVar2 = pointmark(this,fapex);
            uVar3 = pointmark(this,_geomtag);
            printf("  Facet:   [%d,%d,%d] #%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                   (ulong)local_58);
          }
        }
      }
      else {
        vVar5 = pointtype(this,pdVar6);
        if (vVar5 == FREEFACETVERTEX) {
          face::face((face *)&p1_1);
          ppdVar7 = point2sh(this,pdVar6);
          sdecode(this,ppdVar7,(face *)&p1_1);
          if (p1_1 == (point)0x0) {
            terminatetetgen(this,2);
          }
          else {
            pdVar8 = sorg(this,(face *)&p1_1);
            pt = sdest(this,(face *)&p1_1);
            pt_00 = sapex(this,(face *)&p1_1);
            if (facemark == 1) {
              printf("PLC Error:  A segment and a facet intersect at point");
              printf(" (%g,%g,%g).\n",*pdVar6,pdVar6[1],pdVar6[2]);
              uVar1 = pointmark(this,fdest);
              uVar2 = pointmark(this,fapex);
              printf("  Segment : [%d, %d], #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)local_58,
                     (ulong)(uint)parentsh._12_4_);
              uVar1 = pointmark(this,pdVar8);
              uVar2 = pointmark(this,pt);
              uVar3 = pointmark(this,pt_00);
              uVar4 = shellmark(this,(face *)&p1_1);
              printf("  Facet   : [%d, %d, %d]  #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                     (ulong)uVar4);
            }
            else if (facemark == 2) {
              printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",*pdVar6,pdVar6[1],
                     pdVar6[2]);
              uVar1 = pointmark(this,fdest);
              uVar2 = pointmark(this,fapex);
              uVar3 = pointmark(this,_geomtag);
              printf("  Facet 1: [%d, %d, %d] #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                     (ulong)local_58);
              uVar1 = pointmark(this,pdVar8);
              uVar2 = pointmark(this,pt);
              uVar3 = pointmark(this,pt_00);
              uVar4 = shellmark(this,(face *)&p1_1);
              printf("  Facet 2: [%d, %d, %d] #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                     (ulong)uVar4);
            }
          }
        }
        else {
          vVar5 = pointtype(this,pdVar6);
          if (vVar5 == FREEVOLVERTEX) {
            terminatetetgen(this,2);
          }
          else {
            terminatetetgen(this,2);
          }
        }
      }
    }
    terminatetetgen(this,3);
  }
  else if (dir == ACROSSEDGE) {
    if ((itet->tet[8] != (tetrahedron)0x0) && (itet->tet[8][ver2edge[itet->ver]] != (double *)0x0))
    {
      face::face((face *)&parentsh_4.shver);
      tsspivot1(this,itet,(face *)&parentsh_4.shver);
      face::face((face *)&p1_2);
      spivot(this,(face *)&parentsh_4.shver,(face *)&p1_2);
      pdVar6 = sorg(this,(face *)&parentsh_4.shver);
      P[2] = (double)sdest(this,(face *)&parentsh_4.shver);
      tq = 0.0;
      checksh.shver = 0;
      checksh._12_4_ = 0;
      linelineint(this,e1,e2,pdVar6,(double *)P[2],&local_148,&tp,&tq,(double *)&checksh.shver);
      if (facemark == 1) {
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",local_148,P[0],P[1]);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        printf("  Segment 1: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)local_58,
               (ulong)(uint)parentsh._12_4_);
        uVar1 = pointmark(this,pdVar6);
        uVar2 = pointmark(this,(point)P[2]);
        uVar3 = shellmark(this,(face *)&parentsh_4.shver);
        if (p1_2 == (point)0x0) {
          local_270 = 0;
        }
        else {
          local_270 = shellmark(this,(face *)&p1_2);
        }
        printf("  Segment 2: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)local_270);
      }
      else if (facemark == 2) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n",local_148,P[0],P[1]);
        uVar1 = pointmark(this,pdVar6);
        uVar2 = pointmark(this,(point)P[2]);
        uVar3 = shellmark(this,(face *)&parentsh_4.shver);
        if (p1_2 == (point)0x0) {
          local_280 = 0;
        }
        else {
          local_280 = shellmark(this,(face *)&p1_2);
        }
        printf("  Segment: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)local_280);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        uVar3 = pointmark(this,_geomtag);
        printf("  Facet:   [%d, %d, %d] #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)local_58);
      }
      terminatetetgen(this,3);
    }
  }
  else if (dir == ACROSSFACE) {
    if ((itet->tet[9] != (tetrahedron)0x0) && (itet->tet[9][(int)(itet->ver & 3)] != (double *)0x0))
    {
      face::face((face *)&p1_3);
      tspivot(this,itet,(face *)&p1_3);
      pdVar6 = sorg(this,(face *)&p1_3);
      pdVar8 = sdest(this,(face *)&p1_3);
      ip[2] = (double)sapex(this,(face *)&p1_3);
      local_1c0 = 0.0;
      planelineint(this,pdVar6,pdVar8,(double *)ip[2],e1,e2,&u,&local_1c0);
      if (facemark == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n",u,ip[0],ip[1]);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        printf("  Segment: [%d, %d] #%d (%d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)local_58,
               (ulong)(uint)parentsh._12_4_);
        uVar1 = pointmark(this,pdVar6);
        uVar2 = pointmark(this,pdVar8);
        uVar3 = pointmark(this,(point)ip[2]);
        uVar4 = shellmark(this,(face *)&p1_3);
        printf("  Facet:   [%d, %d, %d] #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4)
        ;
      }
      else if (facemark == 2) {
        printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",u,ip[0],ip[1]);
        uVar1 = pointmark(this,fdest);
        uVar2 = pointmark(this,fapex);
        uVar3 = pointmark(this,_geomtag);
        printf("  Facet 1: [%d, %d, %d] #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)local_58);
        uVar1 = pointmark(this,pdVar6);
        uVar2 = pointmark(this,pdVar8);
        uVar3 = pointmark(this,(point)ip[2]);
        uVar4 = shellmark(this,(face *)&p1_3);
        printf("  Facet 2: [%d, %d, %d] #%d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4)
        ;
      }
      terminatetetgen(this,3);
    }
  }
  else {
    terminatetetgen(this,2);
  }
  return 0;
}

Assistant:

int tetgenmesh::report_selfint_edge(point e1, point e2, face *iedge,
  triface* itet, enum interresult dir)
{
  point forg = NULL, fdest = NULL, fapex = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  if (iedge != NULL) {
    if (iedge->sh[5] != NULL) {
      etype = 2;  // A subface
      forg = e1;
      fdest = e2;
      fapex = sapex(*iedge);
      facemark = shellmark(*iedge);
    } else {
      etype = 1;  // A segment
      forg = farsorg(*iedge);
      fdest = farsdest(*iedge);
      // Get a facet containing this segment.
      face parentsh;
      spivot(*iedge, parentsh);
      if (parentsh.sh != NULL) {
        facemark = shellmark(parentsh);
      }
    }
    geomtag = shellmark(*iedge);
  }

  if (dir == SHAREEDGE) {
    // Two edges (segments) are coincide.
    face colseg;
    tsspivot1(*itet, colseg);
    if (etype == 1) {
      if (colseg.sh != iedge->sh) {
        face parentsh;
        spivot(colseg, parentsh);
        printf("PLC Error:  Two segments are overlapping.\n");
        printf("  Segment 1: [%d, %d] #%d (%d)\n", pointmark(sorg(colseg)),
               pointmark(sdest(colseg)), shellmark(colseg),
               parentsh.sh ? shellmark(parentsh) : 0);
        printf("  Segment 2: [%d, %d] #%d (%d)\n", pointmark(forg),
               pointmark(fdest), geomtag, facemark);
      } else {
        // Two identical segments. Why report it?
        terminatetetgen(this, 2); 
      }
    } else if (etype == 2) {
      printf("PLC Error:  A segment lies in a facet.\n");
      printf("  Segment: [%d, %d] #%d\n", pointmark(sorg(colseg)),
             pointmark(sdest(colseg)), shellmark(colseg));
      printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(forg), 
             pointmark(fdest), pointmark(fapex), geomtag);
    }
  } else if (dir == SHAREFACE) {
    // Two triangles (subfaces) are coincide.
	face colface;
    tspivot(*itet, colface);
	if (etype == 2) {
	  if (colface.sh != iedge->sh) {
	    printf("PLC Error:  Two facets are overlapping.\n");
		printf("  Facet 1:  [%d,%d,%d] #%d\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
		printf("  Facet 2:  [%d,%d,%d] #%d\n", pointmark(sorg(colface)), 
             pointmark(sdest(colface)), pointmark(sapex(colface)), 
			 shellmark(colface));
	  } else {
	    // Two identical subfaces. Why report it?
        terminatetetgen(this, 2); 
	  }
	} else {
	  terminatetetgen(this, 2);
	}
  } else if (dir == ACROSSVERT) {
    point pp = dest(*itet);
    if ((pointtype(pp) == RIDGEVERTEX) || (pointtype(pp) == FACETVERTEX)
        || (pointtype(pp) == VOLVERTEX)) {
      if (etype == 1) {
        printf("PLC Error:  A vertex lies in a segment.\n");
        printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
      } else if (etype == 2) {
        printf("PLC Error:  A vertex lies in a facet.\n");
        printf("  Vertex: [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
        printf("  Facet:  [%d,%d,%d] #%d\n", pointmark(forg), pointmark(fdest),
               pointmark(fapex), geomtag);
      }
    } else if (pointtype(pp) == FREESEGVERTEX) {
      face parentseg, parentsh;
      sdecode(point2sh(pp), parentseg);
      spivot(parentseg, parentsh);
      if (parentseg.sh != NULL) {
        point p1 = farsorg(parentseg);
        point p2 = farsdest(parentseg);
        if (etype == 1) {
          printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",
                 pp[0], pp[1], pp[2]);
          printf("  Segment 1: [%d, %d], #%d (%d)\n", pointmark(forg), 
                 pointmark(fdest), geomtag, facemark);
          printf("  Segment 2: [%d, %d], #%d (%d)\n", pointmark(p1), 
                 pointmark(p2), shellmark(parentseg),
                 parentsh.sh ? shellmark(parentsh) : 0);
        } else if (etype == 2) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n", pp[0], pp[1], pp[2]);
          printf("  Segment: [%d, %d], #%d (%d)\n", pointmark(p1),
                 pointmark(p2), shellmark(parentseg),
                 parentsh.sh ? shellmark(parentsh) : 0);
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(forg), 
                 pointmark(fdest), pointmark(fapex), geomtag);
        }
      } else {
        terminatetetgen(this, 2); // Report a bug.
      }
    } else if (pointtype(pp) == FREEFACETVERTEX) {
      face parentsh;
      sdecode(point2sh(pp), parentsh);
      if (parentsh.sh != NULL) {
        point p1 = sorg(parentsh);
        point p2 = sdest(parentsh);
        point p3 = sapex(parentsh);
        if (etype == 1) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n", pp[0], pp[1], pp[2]);
          printf("  Segment : [%d, %d], #%d (%d)\n", pointmark(forg), 
                 pointmark(fdest), geomtag, facemark);
          printf("  Facet   : [%d, %d, %d]  #%d.\n", pointmark(p1),
                 pointmark(p2), pointmark(p3), shellmark(parentsh));
        } else if (etype == 2) {
          printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",
                 pp[0], pp[1], pp[2]);
          printf("  Facet 1: [%d, %d, %d] #%d.\n", pointmark(forg), 
                 pointmark(fdest), pointmark(fapex), geomtag);
          printf("  Facet 2: [%d, %d, %d] #%d.\n", pointmark(p1),
                 pointmark(p2), pointmark(p3), shellmark(parentsh));
        }
      } else {
        terminatetetgen(this, 2); // Report a bug.
      }
    } else if (pointtype(pp) == FREEVOLVERTEX) {
      // This is not a PLC error. 
      // We should shift the vertex.
      // not down yet.
      terminatetetgen(this, 2); // Report a bug.
    } else {
      terminatetetgen(this, 2); // Report a bug.
    }
    terminatetetgen(this, 3);
  } else if (dir == ACROSSEDGE) {
    if (issubseg(*itet)) {
      face checkseg;
      tsspivot1(*itet, checkseg);
      face parentsh;
      spivot(checkseg, parentsh);
      // Calulcate the intersecting point.
      point p1 = sorg(checkseg);
      point p2 = sdest(checkseg);
      REAL P[3], Q[3], tp = 0, tq = 0;
      linelineint(e1, e2, p1, p2, P, Q, &tp, &tq);
      if (etype == 1) {
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g).\n",
               P[0], P[1], P[2]);
        printf("  Segment 1: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
        printf("  Segment 2: [%d, %d] #%d (%d)\n", pointmark(p1), 
               pointmark(p2), shellmark(checkseg),
               parentsh.sh ? shellmark(parentsh) : 0);
      } else if (etype == 2) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", P[0], P[1], P[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(p1), 
               pointmark(p2), shellmark(checkseg),
               parentsh.sh ? shellmark(parentsh) : 0);
        printf("  Facet:   [%d, %d, %d] #%d.\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
      }
      terminatetetgen(this, 3);
    }
  } else if (dir == ACROSSFACE) {
    if (issubface(*itet)) {
      face checksh;
      tspivot(*itet, checksh);
      point p1 = sorg(checksh);
      point p2 = sdest(checksh);
      point p3 = sapex(checksh);
      REAL ip[3], u = 0;
      planelineint(p1, p2, p3, e1, e2, ip, &u);
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d, %d] #%d (%d)\n", pointmark(forg), 
               pointmark(fdest), geomtag, facemark);
        printf("  Facet:   [%d, %d, %d] #%d.\n", pointmark(p1),
               pointmark(p2), pointmark(p3), shellmark(checksh));
      } else if (etype == 2) {
        printf("PLC Error:  Two facets intersect at point (%g,%g,%g).\n",
               ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d, %d, %d] #%d.\n", pointmark(forg), 
               pointmark(fdest), pointmark(fapex), geomtag);
        printf("  Facet 2: [%d, %d, %d] #%d.\n", pointmark(p1),
               pointmark(p2), pointmark(p3), shellmark(checksh));
      }
      terminatetetgen(this, 3);
    }
  } else {
    // An unknown 'dir'.
    terminatetetgen(this, 2);
  }
  return 0;
}